

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

void * rar_read_ahead(archive_read *a,size_t min,ssize_t *avail)

{
  byte *pbVar1;
  size_t sVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  
  while( true ) {
    pbVar1 = (byte *)a->format->data;
    pvVar4 = __archive_read_ahead(a,min,avail);
    if (avail == (ssize_t *)0x0) {
      return pvVar4;
    }
    sVar5 = *avail;
    if (((a->archive).read_data_is_posix_read != '\0') &&
       (sVar2 = (a->archive).read_data_requested, (long)sVar2 < (long)sVar5)) {
      *avail = sVar2;
      sVar5 = sVar2;
    }
    sVar2 = *(size_t *)(pbVar1 + 0xa8);
    if ((long)sVar2 < (long)sVar5) {
      *avail = sVar2;
      sVar5 = sVar2;
    }
    if ((long)sVar5 < 0) {
      return (void *)0x0;
    }
    if (sVar5 != 0) {
      return pvVar4;
    }
    if ((*pbVar1 & 1) == 0) break;
    if ((pbVar1[0x18] & 2) == 0) {
      return pvVar4;
    }
    pbVar1[0x110] = 1;
    iVar3 = archive_read_format_rar_read_header(a,a->entry);
    if (iVar3 == 1) {
      pbVar1[0xfc] = 1;
      iVar3 = archive_read_format_rar_read_header(a,a->entry);
    }
    pbVar1[0x110] = 0;
    if (iVar3 != 0) {
      return (void *)0x0;
    }
  }
  return pvVar4;
}

Assistant:

static const void *
rar_read_ahead(struct archive_read *a, size_t min, ssize_t *avail)
{
  struct rar *rar = (struct rar *)(a->format->data);
  const void *h = __archive_read_ahead(a, min, avail);
  int ret;
  if (avail)
  {
    if (a->archive.read_data_is_posix_read && *avail > (ssize_t)a->archive.read_data_requested)
      *avail = a->archive.read_data_requested;
    if (*avail > rar->bytes_remaining)
      *avail = (ssize_t)rar->bytes_remaining;
    if (*avail < 0)
      return NULL;
    else if (*avail == 0 && rar->main_flags & MHD_VOLUME &&
      rar->file_flags & FHD_SPLIT_AFTER)
    {
      rar->filename_must_match = 1;
      ret = archive_read_format_rar_read_header(a, a->entry);
      if (ret == (ARCHIVE_EOF))
      {
        rar->has_endarc_header = 1;
        ret = archive_read_format_rar_read_header(a, a->entry);
      }
      rar->filename_must_match = 0;
      if (ret != (ARCHIVE_OK))
        return NULL;
      return rar_read_ahead(a, min, avail);
    }
  }
  return h;
}